

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::ShowMetricsWindow(bool *p_open)

{
  ImGuiViewportP *pIVar1;
  ImFontAtlas *atlas_00;
  ImGuiWindow *pIVar2;
  ImGuiContext *pIVar3;
  ImVec2 this;
  bool bVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  char *pcVar8;
  ImRect *pIVar9;
  ImDrawList *pIVar10;
  ImGuiViewportP **ppIVar11;
  ImDrawList **ppIVar12;
  ImGuiPopupData *pIVar13;
  ImGuiTabBar *tab_bar_00;
  ImGuiSettingsHandler *pIVar14;
  ImGuiWindow **ppIVar15;
  ImGuiTable *pIVar16;
  float fVar17;
  float fVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  float local_530;
  char *local_510;
  char *local_508;
  char *local_500;
  char *local_4f8;
  char *local_4f0;
  char *local_4e8;
  char *local_4e0;
  char *local_4a0;
  undefined1 local_36c [8];
  ImRect r_5;
  float thickness;
  ImU32 col;
  ImRect r_4;
  int column_n_1;
  ImDrawList *draw_list_1;
  ImGuiTable *table_2;
  int table_n_1;
  ImVec2 local_324;
  float local_31c;
  char local_318 [4];
  float font_size;
  char buf_1 [32];
  undefined1 local_2f0 [8];
  ImRect r_3;
  ImDrawList *draw_list;
  ImGuiWindow *window_1;
  int n_3;
  char *input_source_names [6];
  ImGuiTableSettings *local_290;
  ImGuiTableSettings *settings_1;
  ImGuiWindowSettings *settings;
  int n_2;
  ImFontAtlas *atlas;
  ImGuiTable *table_1;
  int n_1;
  ImGuiTabBar *tab_bar;
  int n;
  ImGuiWindow *window;
  int i_1;
  int i;
  int draw_list_i;
  int layer_i;
  ImGuiViewportP *viewport;
  int local_228;
  int viewport_i_1;
  int viewport_i;
  int drawlist_count;
  ImVec2 local_218;
  ImVec2 local_210;
  ImVec2 local_208;
  ImVec2 local_200;
  undefined1 local_1f8 [8];
  ImRect r_2;
  ImVec2 local_1e0;
  ImVec2 local_1d8;
  ImVec2 local_1d0;
  ImVec2 local_1c8;
  undefined1 local_1c0 [8];
  ImRect r_1;
  int column_n;
  int rect_n_1;
  char buf [128];
  ImVec2 local_120;
  ImVec2 local_118;
  ImVec2 local_110;
  ImVec2 local_108;
  ImGuiTable *local_100;
  ImGuiTable *table;
  int table_n;
  ImRect r;
  int rect_n;
  char *local_d8;
  char *trt_rects_names [13];
  char *local_68;
  char *wrt_rects_names [8];
  ImGuiMetricsConfig *cfg;
  ImGuiIO *io;
  ImGuiContext *g;
  bool *p_open_local;
  
  bVar4 = Begin("Dear ImGui Metrics/Debugger",p_open,0);
  pIVar3 = GImGui;
  if (bVar4) {
    wrt_rects_names[7] = &(GImGui->DebugMetricsConfig).ShowWindowsRects;
    pcVar8 = GetVersion();
    Text("Dear ImGui %s",pcVar8);
    Text("Application average %.3f ms/frame (%.1f FPS)",(double)(1000.0 / (pIVar3->IO).Framerate));
    Text("%d vertices, %d indices (%d triangles)",(ulong)(uint)(pIVar3->IO).MetricsRenderVertices,
         (ulong)(uint)(pIVar3->IO).MetricsRenderIndices,
         (long)(pIVar3->IO).MetricsRenderIndices / 3 & 0xffffffff);
    Text("%d active windows (%d visible)",(ulong)(uint)(pIVar3->IO).MetricsActiveWindows,
         (ulong)(uint)(pIVar3->IO).MetricsRenderWindows);
    Text("%d active allocations",(ulong)(uint)(pIVar3->IO).MetricsActiveAllocations);
    Separator();
    memcpy(&local_68,&PTR_anon_var_dwarf_46f18_003f04b0,0x40);
    memcpy(&local_d8,&PTR_anon_var_dwarf_46f18_003f04f0,0x68);
    if (*(int *)(wrt_rects_names[7] + 8) < 0) {
      wrt_rects_names[7][8] = '\x04';
      wrt_rects_names[7][9] = '\0';
      wrt_rects_names[7][10] = '\0';
      wrt_rects_names[7][0xb] = '\0';
    }
    if (*(int *)(wrt_rects_names[7] + 0xc) < 0) {
      wrt_rects_names[7][0xc] = '\x02';
      wrt_rects_names[7][0xd] = '\0';
      wrt_rects_names[7][0xe] = '\0';
      wrt_rects_names[7][0xf] = '\0';
    }
    bVar4 = TreeNode("Tools");
    if (bVar4) {
      ImVec2::ImVec2((ImVec2 *)&r.Max.y,0.0,0.0);
      bVar4 = Button("Item Picker..",(ImVec2 *)&r.Max.y);
      if (bVar4) {
        DebugStartItemPicker();
      }
      SameLine(0.0,-1.0);
      MetricsHelpMarker(
                       "Will call the IM_DEBUG_BREAK() macro to break in debugger.\nWarning: If you don\'t have a debugger attached, this will probably crash."
                       );
      Checkbox("Show windows begin order",(bool *)(wrt_rects_names[7] + 1));
      Checkbox("Show windows rectangles",(bool *)wrt_rects_names[7]);
      SameLine(0.0,-1.0);
      fVar18 = GetFontSize();
      SetNextItemWidth(fVar18 * 12.0);
      bVar4 = Combo("##show_windows_rect_type",(int *)(wrt_rects_names[7] + 8),&local_68,8,8);
      *wrt_rects_names[7] = (*wrt_rects_names[7] & 1U) != 0 || bVar4;
      if (((*wrt_rects_names[7] & 1U) != 0) && (pIVar3->NavWindow != (ImGuiWindow *)0x0)) {
        BulletText("\'%s\':",pIVar3->NavWindow->Name);
        Indent(0.0);
        for (r.Max.x = 0.0; (int)r.Max.x < 8; r.Max.x = (float)((int)r.Max.x + 1)) {
          join_0x00001240_0x00001200_ =
               ShowMetricsWindow::Funcs::GetWindowRect(pIVar3->NavWindow,(int)r.Max.x);
          dVar19 = (double)table._4_4_;
          dVar20 = (double)(float)table_n;
          dVar21 = (double)r.Min.x;
          dVar22 = (double)r.Min.y;
          fVar18 = ImRect::GetWidth((ImRect *)((long)&table + 4));
          fVar17 = ImRect::GetHeight((ImRect *)((long)&table + 4));
          Text("(%6.1f,%6.1f) (%6.1f,%6.1f) Size (%6.1f,%6.1f) %s",dVar19,dVar20,dVar21,dVar22,
               (double)fVar18,(double)fVar17,wrt_rects_names[(long)(int)r.Max.x + -1]);
        }
        Unindent(0.0);
      }
      Checkbox("Show ImDrawCmd mesh when hovering",(bool *)(wrt_rects_names[7] + 3));
      Checkbox("Show ImDrawCmd bounding boxes when hovering",(bool *)(wrt_rects_names[7] + 4));
      Checkbox("Show tables rectangles",(bool *)(wrt_rects_names[7] + 2));
      SameLine(0.0,-1.0);
      fVar18 = GetFontSize();
      SetNextItemWidth(fVar18 * 12.0);
      bVar4 = Combo("##show_table_rects_type",(int *)(wrt_rects_names[7] + 0xc),&local_d8,0xd,0xd);
      wrt_rects_names[7][2] = (wrt_rects_names[7][2] & 1U) != 0 || bVar4;
      if (((wrt_rects_names[7][2] & 1U) != 0) && (pIVar3->NavWindow != (ImGuiWindow *)0x0)) {
        for (table._0_4_ = 0; iVar5 = (int)table,
            iVar7 = ImPool<ImGuiTable>::GetBufSize(&pIVar3->Tables), iVar5 < iVar7;
            table._0_4_ = (int)table + 1) {
          local_100 = ImPool<ImGuiTable>::TryGetBufData(&pIVar3->Tables,(int)table);
          if (((local_100 != (ImGuiTable *)0x0) &&
              (pIVar3->FrameCount + -1 <= local_100->LastFrameActive)) &&
             ((local_100->OuterWindow == pIVar3->NavWindow ||
              (local_100->InnerWindow == pIVar3->NavWindow)))) {
            BulletText("Table 0x%08X (%d columns, in \'%s\')",(ulong)local_100->ID,
                       (ulong)(uint)local_100->ColumnsCount,local_100->OuterWindow->Name);
            bVar4 = IsItemHovered(0);
            if (bVar4) {
              pIVar10 = GetForegroundDrawList();
              pIVar9 = &local_100->OuterRect;
              ImVec2::ImVec2(&local_110,1.0,1.0);
              local_108 = operator-(&pIVar9->Min,&local_110);
              pIVar9 = &local_100->OuterRect;
              ImVec2::ImVec2(&local_120,1.0,1.0);
              local_118 = ::operator+(&pIVar9->Max,&local_120);
              ImDrawList::AddRect(pIVar10,&local_108,&local_118,0xff00ffff,0.0,0,2.0);
            }
            Indent(0.0);
            for (r_1.Max.y = 0.0; (int)r_1.Max.y < 0xd; r_1.Max.y = (float)((int)r_1.Max.y + 1)) {
              if ((int)r_1.Max.y < 6) {
                _local_1f8 = ShowMetricsWindow::Funcs::GetTableRect(local_100,(int)r_1.Max.y,-1);
                dVar19 = (double)(float)local_1f8._0_4_;
                dVar20 = (double)(float)local_1f8._4_4_;
                dVar21 = (double)r_2.Min.x;
                dVar22 = (double)r_2.Min.y;
                fVar18 = ImRect::GetWidth((ImRect *)local_1f8);
                fVar17 = ImRect::GetHeight((ImRect *)local_1f8);
                ImFormatString((char *)&column_n,0x80,
                               "(%6.1f,%6.1f) (%6.1f,%6.1f) Size (%6.1f,%6.1f) %s",dVar19,dVar20,
                               dVar21,dVar22,(double)fVar18,(double)fVar17,
                               trt_rects_names[(long)(int)r_1.Max.y + -1]);
                ImVec2::ImVec2(&local_200,0.0,0.0);
                Selectable((char *)&column_n,false,0,&local_200);
                bVar4 = IsItemHovered(0);
                if (bVar4) {
                  pIVar10 = GetForegroundDrawList();
                  ImVec2::ImVec2(&local_210,1.0,1.0);
                  local_208 = operator-((ImVec2 *)local_1f8,&local_210);
                  ImVec2::ImVec2((ImVec2 *)&viewport_i,1.0,1.0);
                  local_218 = ::operator+(&r_2.Min,(ImVec2 *)&viewport_i);
                  ImDrawList::AddRect(pIVar10,&local_208,&local_218,0xff00ffff,0.0,0,2.0);
                }
              }
              else if ((r_1.Max.y == 8.40779e-45) || (r_1.Max.y == 1.12104e-44)) {
                for (r_1.Max.x = 0.0; (int)r_1.Max.x < local_100->ColumnsCount;
                    r_1.Max.x = (float)((int)r_1.Max.x + 1)) {
                  _local_1c0 = ShowMetricsWindow::Funcs::GetTableRect
                                         (local_100,(int)r_1.Max.y,(int)r_1.Max.x);
                  dVar19 = (double)(float)local_1c0._0_4_;
                  dVar20 = (double)(float)local_1c0._4_4_;
                  dVar21 = (double)r_1.Min.x;
                  dVar22 = (double)r_1.Min.y;
                  fVar18 = ImRect::GetWidth((ImRect *)local_1c0);
                  fVar17 = ImRect::GetHeight((ImRect *)local_1c0);
                  ImFormatString((char *)&column_n,0x80,
                                 "(%6.1f,%6.1f) (%6.1f,%6.1f) Size (%6.1f,%6.1f) Col %d %s",dVar19,
                                 dVar20,dVar21,dVar22,(double)fVar18,(double)fVar17,
                                 (ulong)(uint)r_1.Max.x);
                  ImVec2::ImVec2(&local_1c8,0.0,0.0);
                  Selectable((char *)&column_n,false,0,&local_1c8);
                  bVar4 = IsItemHovered(0);
                  if (bVar4) {
                    pIVar10 = GetForegroundDrawList();
                    ImVec2::ImVec2(&local_1d8,1.0,1.0);
                    local_1d0 = operator-((ImVec2 *)local_1c0,&local_1d8);
                    ImVec2::ImVec2(&r_2.Max,1.0,1.0);
                    local_1e0 = ::operator+(&r_1.Min,&r_2.Max);
                    ImDrawList::AddRect(pIVar10,&local_1d0,&local_1e0,0xff00ffff,0.0,0,2.0);
                  }
                }
              }
            }
            Unindent(0.0);
          }
        }
      }
      TreePop();
    }
    DebugNodeWindowsList(&pIVar3->Windows,"Windows");
    viewport_i_1 = 0;
    for (local_228 = 0; local_228 < (pIVar3->Viewports).Size; local_228 = local_228 + 1) {
      ppIVar11 = ImVector<ImGuiViewportP_*>::operator[](&pIVar3->Viewports,local_228);
      iVar5 = ImDrawDataBuilder::GetDrawListCount(&(*ppIVar11)->DrawDataBuilder);
      viewport_i_1 = iVar5 + viewport_i_1;
    }
    bVar4 = TreeNode("DrawLists","DrawLists (%d)",(ulong)(uint)viewport_i_1);
    if (bVar4) {
      for (viewport._4_4_ = 0; viewport._4_4_ < (pIVar3->Viewports).Size;
          viewport._4_4_ = viewport._4_4_ + 1) {
        ppIVar11 = ImVector<ImGuiViewportP_*>::operator[](&pIVar3->Viewports,viewport._4_4_);
        pIVar1 = *ppIVar11;
        for (i = 0; i < 2; i = i + 1) {
          for (i_1 = 0; i_1 < (pIVar1->DrawDataBuilder).Layers[i].Size; i_1 = i_1 + 1) {
            ppIVar12 = ImVector<ImDrawList_*>::operator[]((pIVar1->DrawDataBuilder).Layers + i,i_1);
            DebugNodeDrawList((ImGuiWindow *)0x0,*ppIVar12,"DrawList");
          }
        }
      }
      TreePop();
    }
    bVar4 = TreeNode("Viewports","Viewports (%d)",(ulong)(uint)(pIVar3->Viewports).Size);
    if (bVar4) {
      fVar18 = GetTreeNodeToLabelSpacing();
      Indent(fVar18);
      RenderViewportsThumbnails();
      fVar18 = GetTreeNodeToLabelSpacing();
      Unindent(fVar18);
      for (window._4_4_ = 0; window._4_4_ < (pIVar3->Viewports).Size;
          window._4_4_ = window._4_4_ + 1) {
        ppIVar11 = ImVector<ImGuiViewportP_*>::operator[](&pIVar3->Viewports,window._4_4_);
        DebugNodeViewport(*ppIVar11);
      }
      TreePop();
    }
    bVar4 = TreeNode("Popups","Popups (%d)",(ulong)(uint)(pIVar3->OpenPopupStack).Size);
    if (bVar4) {
      for (window._0_4_ = 0; (int)window < (pIVar3->OpenPopupStack).Size;
          window._0_4_ = (int)window + 1) {
        pIVar13 = ImVector<ImGuiPopupData>::operator[](&pIVar3->OpenPopupStack,(int)window);
        pIVar2 = pIVar13->Window;
        pIVar13 = ImVector<ImGuiPopupData>::operator[](&pIVar3->OpenPopupStack,(int)window);
        if (pIVar2 == (ImGuiWindow *)0x0) {
          local_4a0 = "NULL";
        }
        else {
          local_4a0 = pIVar2->Name;
        }
        bVar4 = false;
        if (pIVar2 != (ImGuiWindow *)0x0) {
          bVar4 = (pIVar2->Flags & 0x1000000U) != 0;
        }
        pcVar8 = "";
        if (bVar4) {
          pcVar8 = " ChildWindow";
        }
        BulletText("PopupID: %08x, Window: \'%s\'%s%s",(ulong)pIVar13->PopupId,local_4a0,pcVar8);
      }
      TreePop();
    }
    uVar6 = ImPool<ImGuiTabBar>::GetAliveCount(&pIVar3->TabBars);
    bVar4 = TreeNode("TabBars","Tab Bars (%d)",(ulong)uVar6);
    if (bVar4) {
      for (tab_bar._4_4_ = 0; iVar5 = ImPool<ImGuiTabBar>::GetBufSize(&pIVar3->TabBars),
          tab_bar._4_4_ < iVar5; tab_bar._4_4_ = tab_bar._4_4_ + 1) {
        tab_bar_00 = ImPool<ImGuiTabBar>::TryGetBufData(&pIVar3->TabBars,tab_bar._4_4_);
        if (tab_bar_00 != (ImGuiTabBar *)0x0) {
          PushID(tab_bar_00);
          DebugNodeTabBar(tab_bar_00,"TabBar");
          PopID();
        }
      }
      TreePop();
    }
    uVar6 = ImPool<ImGuiTable>::GetAliveCount(&pIVar3->Tables);
    bVar4 = TreeNode("Tables","Tables (%d)",(ulong)uVar6);
    if (bVar4) {
      for (table_1._4_4_ = 0; iVar5 = ImPool<ImGuiTable>::GetBufSize(&pIVar3->Tables),
          table_1._4_4_ < iVar5; table_1._4_4_ = table_1._4_4_ + 1) {
        pIVar16 = ImPool<ImGuiTable>::TryGetBufData(&pIVar3->Tables,table_1._4_4_);
        if (pIVar16 != (ImGuiTable *)0x0) {
          DebugNodeTable(pIVar16);
        }
      }
      TreePop();
    }
    atlas_00 = (pIVar3->IO).Fonts;
    bVar4 = TreeNode("Fonts","Fonts (%d)",(ulong)(uint)(atlas_00->Fonts).Size);
    if (bVar4) {
      ShowFontAtlas(atlas_00);
      TreePop();
    }
    bVar4 = TreeNode("Settings");
    if (bVar4) {
      bVar4 = SmallButton("Clear");
      if (bVar4) {
        ClearIniSettings();
      }
      SameLine(0.0,-1.0);
      bVar4 = SmallButton("Save to memory");
      if (bVar4) {
        SaveIniSettingsToMemory((size_t *)0x0);
      }
      SameLine(0.0,-1.0);
      bVar4 = SmallButton("Save to disk");
      if (bVar4) {
        SaveIniSettingsToDisk((pIVar3->IO).IniFilename);
      }
      SameLine(0.0,-1.0);
      if ((pIVar3->IO).IniFilename == (char *)0x0) {
        TextUnformatted("<NULL>",(char *)0x0);
      }
      else {
        Text("\"%s\"",(pIVar3->IO).IniFilename);
      }
      Text("SettingsDirtyTimer %.2f",(double)pIVar3->SettingsDirtyTimer);
      bVar4 = TreeNode("SettingsHandlers","Settings handlers: (%d)",
                       (ulong)(uint)(pIVar3->SettingsHandlers).Size);
      if (bVar4) {
        for (settings._4_4_ = 0; settings._4_4_ < (pIVar3->SettingsHandlers).Size;
            settings._4_4_ = settings._4_4_ + 1) {
          pIVar14 = ImVector<ImGuiSettingsHandler>::operator[]
                              (&pIVar3->SettingsHandlers,settings._4_4_);
          BulletText("%s",pIVar14->TypeName);
        }
        TreePop();
      }
      uVar6 = ImChunkStream<ImGuiWindowSettings>::size(&pIVar3->SettingsWindows);
      bVar4 = TreeNode("SettingsWindows","Settings packed data: Windows: %d bytes",(ulong)uVar6);
      if (bVar4) {
        for (settings_1 = (ImGuiTableSettings *)
                          ImChunkStream<ImGuiWindowSettings>::begin(&pIVar3->SettingsWindows);
            settings_1 != (ImGuiTableSettings *)0x0;
            settings_1 = (ImGuiTableSettings *)
                         ImChunkStream<ImGuiWindowSettings>::next_chunk
                                   (&pIVar3->SettingsWindows,(ImGuiWindowSettings *)settings_1)) {
          DebugNodeWindowSettings((ImGuiWindowSettings *)settings_1);
        }
        TreePop();
      }
      uVar6 = ImChunkStream<ImGuiTableSettings>::size(&pIVar3->SettingsTables);
      bVar4 = TreeNode("SettingsTables","Settings packed data: Tables: %d bytes",(ulong)uVar6);
      if (bVar4) {
        for (local_290 = ImChunkStream<ImGuiTableSettings>::begin(&pIVar3->SettingsTables);
            local_290 != (ImGuiTableSettings *)0x0;
            local_290 = ImChunkStream<ImGuiTableSettings>::next_chunk
                                  (&pIVar3->SettingsTables,local_290)) {
          DebugNodeTableSettings(local_290);
        }
        TreePop();
      }
      uVar6 = ImGuiTextBuffer::size(&pIVar3->SettingsIniData);
      bVar4 = TreeNode("SettingsIniData","Settings unpacked data (.ini): %d bytes",(ulong)uVar6);
      if (bVar4) {
        pcVar8 = ImGuiTextBuffer::c_str(&pIVar3->SettingsIniData);
        iVar5 = (pIVar3->SettingsIniData).Buf.Size;
        fVar18 = GetTextLineHeight();
        ImVec2::ImVec2((ImVec2 *)(input_source_names + 5),-1.1754944e-38,fVar18 * 20.0);
        InputTextMultiline("##Ini",pcVar8,(long)iVar5,(ImVec2 *)(input_source_names + 5),0x4000,
                           (ImGuiInputTextCallback)0x0,(void *)0x0);
        TreePop();
      }
      TreePop();
    }
    bVar4 = TreeNode("Internal state");
    if (bVar4) {
      memcpy(&stack0xfffffffffffffd38,&DAT_003f0560,0x30);
      Text("WINDOWING");
      Indent(0.0);
      if (pIVar3->HoveredWindow == (ImGuiWindow *)0x0) {
        local_4e0 = "NULL";
      }
      else {
        local_4e0 = pIVar3->HoveredWindow->Name;
      }
      Text("HoveredWindow: \'%s\'",local_4e0);
      if (pIVar3->HoveredWindow == (ImGuiWindow *)0x0) {
        local_4e8 = "NULL";
      }
      else {
        local_4e8 = pIVar3->HoveredWindow->RootWindow->Name;
      }
      Text("HoveredWindow->Root: \'%s\'",local_4e8);
      if (pIVar3->HoveredWindowUnderMovingWindow == (ImGuiWindow *)0x0) {
        local_4f0 = "NULL";
      }
      else {
        local_4f0 = pIVar3->HoveredWindowUnderMovingWindow->Name;
      }
      Text("HoveredWindowUnderMovingWindow: \'%s\'",local_4f0);
      if (pIVar3->MovingWindow == (ImGuiWindow *)0x0) {
        local_4f8 = "NULL";
      }
      else {
        local_4f8 = pIVar3->MovingWindow->Name;
      }
      Text("MovingWindow: \'%s\'",local_4f8);
      Unindent(0.0);
      Text("ITEMS");
      Indent(0.0);
      Text("ActiveId: 0x%08X/0x%08X (%.2f sec), AllowOverlap: %d, Source: %s",
           (double)pIVar3->ActiveIdTimer,(ulong)pIVar3->ActiveId,
           (ulong)pIVar3->ActiveIdPreviousFrame,(ulong)(pIVar3->ActiveIdAllowOverlap & 1),
           *(undefined8 *)(&stack0xfffffffffffffd38 + (ulong)pIVar3->ActiveIdSource * 8));
      if (pIVar3->ActiveIdWindow == (ImGuiWindow *)0x0) {
        local_500 = "NULL";
      }
      else {
        local_500 = pIVar3->ActiveIdWindow->Name;
      }
      Text("ActiveIdWindow: \'%s\'",local_500);
      Text("HoveredId: 0x%08X/0x%08X (%.2f sec), AllowOverlap: %d",(double)pIVar3->HoveredIdTimer,
           (ulong)pIVar3->HoveredId,(ulong)pIVar3->HoveredIdPreviousFrame,
           (ulong)(pIVar3->HoveredIdAllowOverlap & 1));
      Text("DragDrop: %d, SourceId = 0x%08X, Payload \"%s\" (%d bytes)",
           (ulong)(pIVar3->DragDropActive & 1),(ulong)(pIVar3->DragDropPayload).SourceId,
           (pIVar3->DragDropPayload).DataType);
      Unindent(0.0);
      Text("NAV,FOCUS");
      Indent(0.0);
      if (pIVar3->NavWindow == (ImGuiWindow *)0x0) {
        local_508 = "NULL";
      }
      else {
        local_508 = pIVar3->NavWindow->Name;
      }
      Text("NavWindow: \'%s\'",local_508);
      Text("NavId: 0x%08X, NavLayer: %d",(ulong)pIVar3->NavId,(ulong)pIVar3->NavLayer);
      Text("NavInputSource: %s",
           *(undefined8 *)(&stack0xfffffffffffffd38 + (ulong)pIVar3->NavInputSource * 8));
      Text("NavActive: %d, NavVisible: %d",(ulong)((pIVar3->IO).NavActive & 1),
           (ulong)((pIVar3->IO).NavVisible & 1));
      Text("NavActivateId: 0x%08X, NavInputId: 0x%08X",(ulong)pIVar3->NavActivateId,
           (ulong)pIVar3->NavInputId);
      Text("NavDisableHighlight: %d, NavDisableMouseHover: %d",
           (ulong)(pIVar3->NavDisableHighlight & 1),(ulong)(pIVar3->NavDisableMouseHover & 1));
      Text("NavFocusScopeId = 0x%08X",(ulong)pIVar3->NavFocusScopeId);
      if (pIVar3->NavWindowingTarget == (ImGuiWindow *)0x0) {
        local_510 = "NULL";
      }
      else {
        local_510 = pIVar3->NavWindowingTarget->Name;
      }
      Text("NavWindowingTarget: \'%s\'",local_510);
      Unindent(0.0);
      TreePop();
    }
    if (((*wrt_rects_names[7] & 1U) != 0) || ((wrt_rects_names[7][1] & 1U) != 0)) {
      for (window_1._4_4_ = 0; window_1._4_4_ < (pIVar3->Windows).Size;
          window_1._4_4_ = window_1._4_4_ + 1) {
        ppIVar15 = ImVector<ImGuiWindow_*>::operator[](&pIVar3->Windows,window_1._4_4_);
        pIVar2 = *ppIVar15;
        if ((pIVar2->WasActive & 1U) != 0) {
          r_3.Max = (ImVec2)GetForegroundDrawList(pIVar2);
          if ((*wrt_rects_names[7] & 1U) != 0) {
            _local_2f0 = ShowMetricsWindow::Funcs::GetWindowRect
                                   (pIVar2,*(int *)(wrt_rects_names[7] + 8));
            ImDrawList::AddRect((ImDrawList *)r_3.Max,(ImVec2 *)local_2f0,&r_3.Min,0xff8000ff,0.0,0,
                                1.0);
          }
          if (((wrt_rects_names[7][1] & 1U) != 0) && ((pIVar2->Flags & 0x1000000U) == 0)) {
            ImFormatString(local_318,0x20,"%d",(ulong)(uint)(int)pIVar2->BeginOrderWithinContext);
            local_31c = GetFontSize();
            this = r_3.Max;
            ImVec2::ImVec2((ImVec2 *)((long)&table_2 + 4),local_31c,local_31c);
            local_324 = ::operator+(&pIVar2->Pos,(ImVec2 *)((long)&table_2 + 4));
            ImDrawList::AddRectFilled((ImDrawList *)this,&pIVar2->Pos,&local_324,0xff6464c8,0.0,0);
            ImDrawList::AddText((ImDrawList *)r_3.Max,&pIVar2->Pos,0xffffffff,local_318,(char *)0x0)
            ;
          }
        }
      }
    }
    if ((wrt_rects_names[7][2] & 1U) != 0) {
      for (table_2._0_4_ = 0; iVar5 = (int)table_2,
          iVar7 = ImPool<ImGuiTable>::GetBufSize(&pIVar3->Tables), iVar5 < iVar7;
          table_2._0_4_ = (int)table_2 + 1) {
        pIVar16 = ImPool<ImGuiTable>::TryGetBufData(&pIVar3->Tables,(int)table_2);
        if ((pIVar16 != (ImGuiTable *)0x0) && (pIVar3->FrameCount + -1 <= pIVar16->LastFrameActive))
        {
          register0x00000000 = GetForegroundDrawList(pIVar16->OuterWindow);
          if (*(int *)(wrt_rects_names[7] + 0xc) < 6) {
            _local_36c = ShowMetricsWindow::Funcs::GetTableRect
                                   (pIVar16,*(int *)(wrt_rects_names[7] + 0xc),-1);
            ImDrawList::AddRect(stack0xfffffffffffffcc0,(ImVec2 *)local_36c,&r_5.Min,0xff8000ff,0.0,
                                0,1.0);
          }
          else {
            for (r_4.Max.x = 0.0; (int)r_4.Max.x < pIVar16->ColumnsCount;
                r_4.Max.x = (float)((int)r_4.Max.x + 1)) {
              _thickness = ShowMetricsWindow::Funcs::GetTableRect
                                     (pIVar16,*(int *)(wrt_rects_names[7] + 0xc),(int)r_4.Max.x);
              r_5.Max.y = -NAN;
              if ((float)(int)pIVar16->HoveredColumnBody == r_4.Max.x) {
                r_5.Max.y = -NAN;
              }
              local_530 = 3.0;
              if ((float)(int)pIVar16->HoveredColumnBody != r_4.Max.x) {
                local_530 = 1.0;
              }
              r_5.Max.x = local_530;
              ImDrawList::AddRect(stack0xfffffffffffffcc0,(ImVec2 *)&thickness,&r_4.Min,
                                  (ImU32)r_5.Max.y,0.0,0,local_530);
            }
          }
        }
      }
    }
    End();
  }
  else {
    End();
  }
  return;
}

Assistant:

void ImGui::ShowMetricsWindow(bool* p_open)
{
    if (!Begin("Dear ImGui Metrics/Debugger", p_open))
    {
        End();
        return;
    }

    ImGuiContext& g = *GImGui;
    ImGuiIO& io = g.IO;
    ImGuiMetricsConfig* cfg = &g.DebugMetricsConfig;

    // Basic info
    Text("Dear ImGui %s", GetVersion());
    Text("Application average %.3f ms/frame (%.1f FPS)", 1000.0f / io.Framerate, io.Framerate);
    Text("%d vertices, %d indices (%d triangles)", io.MetricsRenderVertices, io.MetricsRenderIndices, io.MetricsRenderIndices / 3);
    Text("%d active windows (%d visible)", io.MetricsActiveWindows, io.MetricsRenderWindows);
    Text("%d active allocations", io.MetricsActiveAllocations);
    //SameLine(); if (SmallButton("GC")) { g.GcCompactAll = true; }

    Separator();

    // Debugging enums
    enum { WRT_OuterRect, WRT_OuterRectClipped, WRT_InnerRect, WRT_InnerClipRect, WRT_WorkRect, WRT_Content, WRT_ContentIdeal, WRT_ContentRegionRect, WRT_Count }; // Windows Rect Type
    const char* wrt_rects_names[WRT_Count] = { "OuterRect", "OuterRectClipped", "InnerRect", "InnerClipRect", "WorkRect", "Content", "ContentIdeal", "ContentRegionRect" };
    enum { TRT_OuterRect, TRT_InnerRect, TRT_WorkRect, TRT_HostClipRect, TRT_InnerClipRect, TRT_BackgroundClipRect, TRT_ColumnsRect, TRT_ColumnsWorkRect, TRT_ColumnsClipRect, TRT_ColumnsContentHeadersUsed, TRT_ColumnsContentHeadersIdeal, TRT_ColumnsContentFrozen, TRT_ColumnsContentUnfrozen, TRT_Count }; // Tables Rect Type
    const char* trt_rects_names[TRT_Count] = { "OuterRect", "InnerRect", "WorkRect", "HostClipRect", "InnerClipRect", "BackgroundClipRect", "ColumnsRect", "ColumnsWorkRect", "ColumnsClipRect", "ColumnsContentHeadersUsed", "ColumnsContentHeadersIdeal", "ColumnsContentFrozen", "ColumnsContentUnfrozen" };
    if (cfg->ShowWindowsRectsType < 0)
        cfg->ShowWindowsRectsType = WRT_WorkRect;
    if (cfg->ShowTablesRectsType < 0)
        cfg->ShowTablesRectsType = TRT_WorkRect;

    struct Funcs
    {
        static ImRect GetTableRect(ImGuiTable* table, int rect_type, int n)
        {
            if (rect_type == TRT_OuterRect)                     { return table->OuterRect; }
            else if (rect_type == TRT_InnerRect)                { return table->InnerRect; }
            else if (rect_type == TRT_WorkRect)                 { return table->WorkRect; }
            else if (rect_type == TRT_HostClipRect)             { return table->HostClipRect; }
            else if (rect_type == TRT_InnerClipRect)            { return table->InnerClipRect; }
            else if (rect_type == TRT_BackgroundClipRect)       { return table->BgClipRect; }
            else if (rect_type == TRT_ColumnsRect)              { ImGuiTableColumn* c = &table->Columns[n]; return ImRect(c->MinX, table->InnerClipRect.Min.y, c->MaxX, table->InnerClipRect.Min.y + table->LastOuterHeight); }
            else if (rect_type == TRT_ColumnsWorkRect)          { ImGuiTableColumn* c = &table->Columns[n]; return ImRect(c->WorkMinX, table->WorkRect.Min.y, c->WorkMaxX, table->WorkRect.Max.y); }
            else if (rect_type == TRT_ColumnsClipRect)          { ImGuiTableColumn* c = &table->Columns[n]; return c->ClipRect; }
            else if (rect_type == TRT_ColumnsContentHeadersUsed){ ImGuiTableColumn* c = &table->Columns[n]; return ImRect(c->WorkMinX, table->InnerClipRect.Min.y, c->ContentMaxXHeadersUsed, table->InnerClipRect.Min.y + table->LastFirstRowHeight); } // Note: y1/y2 not always accurate
            else if (rect_type == TRT_ColumnsContentHeadersIdeal){ImGuiTableColumn* c = &table->Columns[n]; return ImRect(c->WorkMinX, table->InnerClipRect.Min.y, c->ContentMaxXHeadersIdeal, table->InnerClipRect.Min.y + table->LastFirstRowHeight); }
            else if (rect_type == TRT_ColumnsContentFrozen)     { ImGuiTableColumn* c = &table->Columns[n]; return ImRect(c->WorkMinX, table->InnerClipRect.Min.y, c->ContentMaxXFrozen, table->InnerClipRect.Min.y + table->LastFirstRowHeight); }
            else if (rect_type == TRT_ColumnsContentUnfrozen)   { ImGuiTableColumn* c = &table->Columns[n]; return ImRect(c->WorkMinX, table->InnerClipRect.Min.y + table->LastFirstRowHeight, c->ContentMaxXUnfrozen, table->InnerClipRect.Max.y); }
            IM_ASSERT(0);
            return ImRect();
        }

        static ImRect GetWindowRect(ImGuiWindow* window, int rect_type)
        {
            if (rect_type == WRT_OuterRect)                 { return window->Rect(); }
            else if (rect_type == WRT_OuterRectClipped)     { return window->OuterRectClipped; }
            else if (rect_type == WRT_InnerRect)            { return window->InnerRect; }
            else if (rect_type == WRT_InnerClipRect)        { return window->InnerClipRect; }
            else if (rect_type == WRT_WorkRect)             { return window->WorkRect; }
            else if (rect_type == WRT_Content)       { ImVec2 min = window->InnerRect.Min - window->Scroll + window->WindowPadding; return ImRect(min, min + window->ContentSize); }
            else if (rect_type == WRT_ContentIdeal)         { ImVec2 min = window->InnerRect.Min - window->Scroll + window->WindowPadding; return ImRect(min, min + window->ContentSizeIdeal); }
            else if (rect_type == WRT_ContentRegionRect)    { return window->ContentRegionRect; }
            IM_ASSERT(0);
            return ImRect();
        }
    };

    // Tools
    if (TreeNode("Tools"))
    {
        // The Item Picker tool is super useful to visually select an item and break into the call-stack of where it was submitted.
        if (Button("Item Picker.."))
            DebugStartItemPicker();
        SameLine();
        MetricsHelpMarker("Will call the IM_DEBUG_BREAK() macro to break in debugger.\nWarning: If you don't have a debugger attached, this will probably crash.");

        Checkbox("Show windows begin order", &cfg->ShowWindowsBeginOrder);
        Checkbox("Show windows rectangles", &cfg->ShowWindowsRects);
        SameLine();
        SetNextItemWidth(GetFontSize() * 12);
        cfg->ShowWindowsRects |= Combo("##show_windows_rect_type", &cfg->ShowWindowsRectsType, wrt_rects_names, WRT_Count, WRT_Count);
        if (cfg->ShowWindowsRects && g.NavWindow != NULL)
        {
            BulletText("'%s':", g.NavWindow->Name);
            Indent();
            for (int rect_n = 0; rect_n < WRT_Count; rect_n++)
            {
                ImRect r = Funcs::GetWindowRect(g.NavWindow, rect_n);
                Text("(%6.1f,%6.1f) (%6.1f,%6.1f) Size (%6.1f,%6.1f) %s", r.Min.x, r.Min.y, r.Max.x, r.Max.y, r.GetWidth(), r.GetHeight(), wrt_rects_names[rect_n]);
            }
            Unindent();
        }
        Checkbox("Show ImDrawCmd mesh when hovering", &cfg->ShowDrawCmdMesh);
        Checkbox("Show ImDrawCmd bounding boxes when hovering", &cfg->ShowDrawCmdBoundingBoxes);

        Checkbox("Show tables rectangles", &cfg->ShowTablesRects);
        SameLine();
        SetNextItemWidth(GetFontSize() * 12);
        cfg->ShowTablesRects |= Combo("##show_table_rects_type", &cfg->ShowTablesRectsType, trt_rects_names, TRT_Count, TRT_Count);
        if (cfg->ShowTablesRects && g.NavWindow != NULL)
        {
            for (int table_n = 0; table_n < g.Tables.GetBufSize(); table_n++)
            {
                ImGuiTable* table = g.Tables.TryGetBufData(table_n);
                if (table == NULL || table->LastFrameActive < g.FrameCount - 1 || (table->OuterWindow != g.NavWindow && table->InnerWindow != g.NavWindow))
                    continue;

                BulletText("Table 0x%08X (%d columns, in '%s')", table->ID, table->ColumnsCount, table->OuterWindow->Name);
                if (IsItemHovered())
                    GetForegroundDrawList()->AddRect(table->OuterRect.Min - ImVec2(1, 1), table->OuterRect.Max + ImVec2(1, 1), IM_COL32(255, 255, 0, 255), 0.0f, 0, 2.0f);
                Indent();
                char buf[128];
                for (int rect_n = 0; rect_n < TRT_Count; rect_n++)
                {
                    if (rect_n >= TRT_ColumnsRect)
                    {
                        if (rect_n != TRT_ColumnsRect && rect_n != TRT_ColumnsClipRect)
                            continue;
                        for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
                        {
                            ImRect r = Funcs::GetTableRect(table, rect_n, column_n);
                            ImFormatString(buf, IM_ARRAYSIZE(buf), "(%6.1f,%6.1f) (%6.1f,%6.1f) Size (%6.1f,%6.1f) Col %d %s", r.Min.x, r.Min.y, r.Max.x, r.Max.y, r.GetWidth(), r.GetHeight(), column_n, trt_rects_names[rect_n]);
                            Selectable(buf);
                            if (IsItemHovered())
                                GetForegroundDrawList()->AddRect(r.Min - ImVec2(1, 1), r.Max + ImVec2(1, 1), IM_COL32(255, 255, 0, 255), 0.0f, 0, 2.0f);
                        }
                    }
                    else
                    {
                        ImRect r = Funcs::GetTableRect(table, rect_n, -1);
                        ImFormatString(buf, IM_ARRAYSIZE(buf), "(%6.1f,%6.1f) (%6.1f,%6.1f) Size (%6.1f,%6.1f) %s", r.Min.x, r.Min.y, r.Max.x, r.Max.y, r.GetWidth(), r.GetHeight(), trt_rects_names[rect_n]);
                        Selectable(buf);
                        if (IsItemHovered())
                            GetForegroundDrawList()->AddRect(r.Min - ImVec2(1, 1), r.Max + ImVec2(1, 1), IM_COL32(255, 255, 0, 255), 0.0f, 0, 2.0f);
                    }
                }
                Unindent();
            }
        }

        TreePop();
    }

    // Windows
    DebugNodeWindowsList(&g.Windows, "Windows");
    //DebugNodeWindowsList(&g.WindowsFocusOrder, "WindowsFocusOrder");

    // DrawLists
    int drawlist_count = 0;
    for (int viewport_i = 0; viewport_i < g.Viewports.Size; viewport_i++)
        drawlist_count += g.Viewports[viewport_i]->DrawDataBuilder.GetDrawListCount();
    if (TreeNode("DrawLists", "DrawLists (%d)", drawlist_count))
    {
        for (int viewport_i = 0; viewport_i < g.Viewports.Size; viewport_i++)
        {
            ImGuiViewportP* viewport = g.Viewports[viewport_i];
            for (int layer_i = 0; layer_i < IM_ARRAYSIZE(viewport->DrawDataBuilder.Layers); layer_i++)
                for (int draw_list_i = 0; draw_list_i < viewport->DrawDataBuilder.Layers[layer_i].Size; draw_list_i++)
                    DebugNodeDrawList(NULL, viewport->DrawDataBuilder.Layers[layer_i][draw_list_i], "DrawList");
        }
        TreePop();
    }

    // Viewports
    if (TreeNode("Viewports", "Viewports (%d)", g.Viewports.Size))
    {
        Indent(GetTreeNodeToLabelSpacing());
        RenderViewportsThumbnails();
        Unindent(GetTreeNodeToLabelSpacing());
        for (int i = 0; i < g.Viewports.Size; i++)
            DebugNodeViewport(g.Viewports[i]);
        TreePop();
    }

    // Details for Popups
    if (TreeNode("Popups", "Popups (%d)", g.OpenPopupStack.Size))
    {
        for (int i = 0; i < g.OpenPopupStack.Size; i++)
        {
            ImGuiWindow* window = g.OpenPopupStack[i].Window;
            BulletText("PopupID: %08x, Window: '%s'%s%s", g.OpenPopupStack[i].PopupId, window ? window->Name : "NULL", window && (window->Flags & ImGuiWindowFlags_ChildWindow) ? " ChildWindow" : "", window && (window->Flags & ImGuiWindowFlags_ChildMenu) ? " ChildMenu" : "");
        }
        TreePop();
    }

    // Details for TabBars
    if (TreeNode("TabBars", "Tab Bars (%d)", g.TabBars.GetAliveCount()))
    {
        for (int n = 0; n < g.TabBars.GetBufSize(); n++)
            if (ImGuiTabBar* tab_bar = g.TabBars.TryGetBufData(n))
            {
                PushID(tab_bar);
                DebugNodeTabBar(tab_bar, "TabBar");
                PopID();
            }
        TreePop();
    }

    // Details for Tables
    if (TreeNode("Tables", "Tables (%d)", g.Tables.GetAliveCount()))
    {
        for (int n = 0; n < g.Tables.GetBufSize(); n++)
            if (ImGuiTable* table = g.Tables.TryGetBufData(n))
                DebugNodeTable(table);
        TreePop();
    }

    // Details for Fonts
#ifndef IMGUI_DISABLE_DEMO_WINDOWS
    ImFontAtlas* atlas = g.IO.Fonts;
    if (TreeNode("Fonts", "Fonts (%d)", atlas->Fonts.Size))
    {
        ShowFontAtlas(atlas);
        TreePop();
    }
#endif

    // Details for Docking
#ifdef IMGUI_HAS_DOCK
    if (TreeNode("Docking"))
    {
        TreePop();
    }
#endif // #ifdef IMGUI_HAS_DOCK

    // Settings
    if (TreeNode("Settings"))
    {
        if (SmallButton("Clear"))
            ClearIniSettings();
        SameLine();
        if (SmallButton("Save to memory"))
            SaveIniSettingsToMemory();
        SameLine();
        if (SmallButton("Save to disk"))
            SaveIniSettingsToDisk(g.IO.IniFilename);
        SameLine();
        if (g.IO.IniFilename)
            Text("\"%s\"", g.IO.IniFilename);
        else
            TextUnformatted("<NULL>");
        Text("SettingsDirtyTimer %.2f", g.SettingsDirtyTimer);
        if (TreeNode("SettingsHandlers", "Settings handlers: (%d)", g.SettingsHandlers.Size))
        {
            for (int n = 0; n < g.SettingsHandlers.Size; n++)
                BulletText("%s", g.SettingsHandlers[n].TypeName);
            TreePop();
        }
        if (TreeNode("SettingsWindows", "Settings packed data: Windows: %d bytes", g.SettingsWindows.size()))
        {
            for (ImGuiWindowSettings* settings = g.SettingsWindows.begin(); settings != NULL; settings = g.SettingsWindows.next_chunk(settings))
                DebugNodeWindowSettings(settings);
            TreePop();
        }

        if (TreeNode("SettingsTables", "Settings packed data: Tables: %d bytes", g.SettingsTables.size()))
        {
            for (ImGuiTableSettings* settings = g.SettingsTables.begin(); settings != NULL; settings = g.SettingsTables.next_chunk(settings))
                DebugNodeTableSettings(settings);
            TreePop();
        }

#ifdef IMGUI_HAS_DOCK
#endif // #ifdef IMGUI_HAS_DOCK

        if (TreeNode("SettingsIniData", "Settings unpacked data (.ini): %d bytes", g.SettingsIniData.size()))
        {
            InputTextMultiline("##Ini", (char*)(void*)g.SettingsIniData.c_str(), g.SettingsIniData.Buf.Size, ImVec2(-FLT_MIN, GetTextLineHeight() * 20), ImGuiInputTextFlags_ReadOnly);
            TreePop();
        }
        TreePop();
    }

    // Misc Details
    if (TreeNode("Internal state"))
    {
        const char* input_source_names[] = { "None", "Mouse", "Keyboard", "Gamepad", "Nav", "Clipboard" }; IM_ASSERT(IM_ARRAYSIZE(input_source_names) == ImGuiInputSource_COUNT);

        Text("WINDOWING");
        Indent();
        Text("HoveredWindow: '%s'", g.HoveredWindow ? g.HoveredWindow->Name : "NULL");
        Text("HoveredWindow->Root: '%s'", g.HoveredWindow ? g.HoveredWindow->RootWindow->Name : "NULL");
        Text("HoveredWindowUnderMovingWindow: '%s'", g.HoveredWindowUnderMovingWindow ? g.HoveredWindowUnderMovingWindow->Name : "NULL");
        Text("MovingWindow: '%s'", g.MovingWindow ? g.MovingWindow->Name : "NULL");
        Unindent();

        Text("ITEMS");
        Indent();
        Text("ActiveId: 0x%08X/0x%08X (%.2f sec), AllowOverlap: %d, Source: %s", g.ActiveId, g.ActiveIdPreviousFrame, g.ActiveIdTimer, g.ActiveIdAllowOverlap, input_source_names[g.ActiveIdSource]);
        Text("ActiveIdWindow: '%s'", g.ActiveIdWindow ? g.ActiveIdWindow->Name : "NULL");
        Text("HoveredId: 0x%08X/0x%08X (%.2f sec), AllowOverlap: %d", g.HoveredId, g.HoveredIdPreviousFrame, g.HoveredIdTimer, g.HoveredIdAllowOverlap); // Data is "in-flight" so depending on when the Metrics window is called we may see current frame information or not
        Text("DragDrop: %d, SourceId = 0x%08X, Payload \"%s\" (%d bytes)", g.DragDropActive, g.DragDropPayload.SourceId, g.DragDropPayload.DataType, g.DragDropPayload.DataSize);
        Unindent();

        Text("NAV,FOCUS");
        Indent();
        Text("NavWindow: '%s'", g.NavWindow ? g.NavWindow->Name : "NULL");
        Text("NavId: 0x%08X, NavLayer: %d", g.NavId, g.NavLayer);
        Text("NavInputSource: %s", input_source_names[g.NavInputSource]);
        Text("NavActive: %d, NavVisible: %d", g.IO.NavActive, g.IO.NavVisible);
        Text("NavActivateId: 0x%08X, NavInputId: 0x%08X", g.NavActivateId, g.NavInputId);
        Text("NavDisableHighlight: %d, NavDisableMouseHover: %d", g.NavDisableHighlight, g.NavDisableMouseHover);
        Text("NavFocusScopeId = 0x%08X", g.NavFocusScopeId);
        Text("NavWindowingTarget: '%s'", g.NavWindowingTarget ? g.NavWindowingTarget->Name : "NULL");
        Unindent();

        TreePop();
    }

    // Overlay: Display windows Rectangles and Begin Order
    if (cfg->ShowWindowsRects || cfg->ShowWindowsBeginOrder)
    {
        for (int n = 0; n < g.Windows.Size; n++)
        {
            ImGuiWindow* window = g.Windows[n];
            if (!window->WasActive)
                continue;
            ImDrawList* draw_list = GetForegroundDrawList(window);
            if (cfg->ShowWindowsRects)
            {
                ImRect r = Funcs::GetWindowRect(window, cfg->ShowWindowsRectsType);
                draw_list->AddRect(r.Min, r.Max, IM_COL32(255, 0, 128, 255));
            }
            if (cfg->ShowWindowsBeginOrder && !(window->Flags & ImGuiWindowFlags_ChildWindow))
            {
                char buf[32];
                ImFormatString(buf, IM_ARRAYSIZE(buf), "%d", window->BeginOrderWithinContext);
                float font_size = GetFontSize();
                draw_list->AddRectFilled(window->Pos, window->Pos + ImVec2(font_size, font_size), IM_COL32(200, 100, 100, 255));
                draw_list->AddText(window->Pos, IM_COL32(255, 255, 255, 255), buf);
            }
        }
    }

    // Overlay: Display Tables Rectangles
    if (cfg->ShowTablesRects)
    {
        for (int table_n = 0; table_n < g.Tables.GetBufSize(); table_n++)
        {
            ImGuiTable* table = g.Tables.TryGetBufData(table_n);
            if (table == NULL || table->LastFrameActive < g.FrameCount - 1)
                continue;
            ImDrawList* draw_list = GetForegroundDrawList(table->OuterWindow);
            if (cfg->ShowTablesRectsType >= TRT_ColumnsRect)
            {
                for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
                {
                    ImRect r = Funcs::GetTableRect(table, cfg->ShowTablesRectsType, column_n);
                    ImU32 col = (table->HoveredColumnBody == column_n) ? IM_COL32(255, 255, 128, 255) : IM_COL32(255, 0, 128, 255);
                    float thickness = (table->HoveredColumnBody == column_n) ? 3.0f : 1.0f;
                    draw_list->AddRect(r.Min, r.Max, col, 0.0f, 0, thickness);
                }
            }
            else
            {
                ImRect r = Funcs::GetTableRect(table, cfg->ShowTablesRectsType, -1);
                draw_list->AddRect(r.Min, r.Max, IM_COL32(255, 0, 128, 255));
            }
        }
    }

#ifdef IMGUI_HAS_DOCK
    // Overlay: Display Docking info
    if (show_docking_nodes && g.IO.KeyCtrl)
    {
    }
#endif // #ifdef IMGUI_HAS_DOCK

    End();
}